

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleNearest(FloatImage *this,float x,float y,int c,WrapMode wm)

{
  WrapMode wm_local;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  if (wm == WrapMode_Clamp) {
    this_local._4_4_ = sampleNearestClamp(this,x,y,c);
  }
  else if (wm == WrapMode_Repeat) {
    this_local._4_4_ = sampleNearestRepeat(this,x,y,c);
  }
  else {
    this_local._4_4_ = sampleNearestMirror(this,x,y,c);
  }
  return this_local._4_4_;
}

Assistant:

float FloatImage::sampleNearest(const float x, const float y, const int c, const WrapMode wm) const
{
	if( wm == WrapMode_Clamp ) return sampleNearestClamp(x, y, c);
	else if( wm == WrapMode_Repeat ) return sampleNearestRepeat(x, y, c);
	else /*if( wm == WrapMode_Mirror )*/ return sampleNearestMirror(x, y, c);
}